

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall S2Loop::BoundaryApproxIntersects(S2Loop *this,Iterator *it,S2Cell *target)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar5;
  S2Point *a_xyz;
  S2Point *b_xyz;
  long lVar6;
  ulong uVar7;
  R2Point v1;
  R2Point v0;
  R2Rect bound;
  
  v0.c_[0] = (VType)(it->super_IteratorBase).id_.id_;
  bVar2 = S2CellId::contains((S2CellId *)&v0,(S2CellId)(target->id_).id_);
  if (!bVar2) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&bound,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x1e5,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)bound.bounds_[0].bounds_.c_[1],
                    "Check failed: it.id().contains(target.id()) ");
    abort();
  }
  bVar2 = false;
  pvVar4 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                     ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                      (it->super_IteratorBase).cell_._M_b._M_p,0);
  if ((1 < *(uint *)&pvVar4->field_0x4) &&
     (bVar2 = true, (it->super_IteratorBase).id_.id_ != (target->id_).id_)) {
    uVar1 = (ulong)(*(uint *)&pvVar4->field_0x4 >> 1);
    if ((BoundaryApproxIntersects(MutableS2ShapeIndex::Iterator_const&,S2Cell_const&)::kMaxError ==
         '\0') &&
       (iVar3 = __cxa_guard_acquire(&BoundaryApproxIntersects(MutableS2ShapeIndex::Iterator_const&,S2Cell_const&)
                                     ::kMaxError), iVar3 != 0)) {
      BoundaryApproxIntersects::kMaxError = 2.3551386880256627e-15;
      __cxa_guard_release(&BoundaryApproxIntersects(MutableS2ShapeIndex::Iterator_const&,S2Cell_const&)
                           ::kMaxError);
    }
    v0.c_[0] = (target->uv_).bounds_[0].bounds_.c_[0];
    v0.c_[1] = (target->uv_).bounds_[0].bounds_.c_[1];
    R2Rect::Expanded(&bound,(R2Rect *)&v0,BoundaryApproxIntersects::kMaxError);
    lVar6 = 0;
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      paVar5 = &pvVar4->field_3;
      if (5 < *(uint *)&pvVar4->field_0x4) {
        paVar5 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar4->field_3).edges_;
      }
      iVar3 = *(int *)((long)paVar5 + lVar6);
      v0.c_[0] = 0.0;
      v0.c_[1] = 0.0;
      v1.c_[0] = 0.0;
      v1.c_[1] = 0.0;
      a_xyz = vertex(this,iVar3);
      b_xyz = vertex(this,iVar3 + 1);
      bVar2 = S2::ClipToPaddedFace
                        (a_xyz,b_xyz,(int)target->face_,BoundaryApproxIntersects::kMaxError,&v0,&v1)
      ;
      if ((bVar2) && (bVar2 = S2::IntersectsRect(&v0,&v1,&bound), bVar2)) {
        return uVar7 < uVar1;
      }
      lVar6 = lVar6 + 4;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool S2Loop::BoundaryApproxIntersects(const MutableS2ShapeIndex::Iterator& it,
                                      const S2Cell& target) const {
  S2_DCHECK(it.id().contains(target.id()));
  const S2ClippedShape& a_clipped = it.cell().clipped(0);
  int a_num_edges = a_clipped.num_edges();

  // If there are no edges, there is no intersection.
  if (a_num_edges == 0) return false;

  // We can save some work if "target" is the index cell itself.
  if (it.id() == target.id()) return true;

  // Otherwise check whether any of the edges intersect "target".
  static const double kMaxError = (S2::kFaceClipErrorUVCoord +
                                   S2::kIntersectsRectErrorUVDist);
  R2Rect bound = target.GetBoundUV().Expanded(kMaxError);
  for (int i = 0; i < a_num_edges; ++i) {
    int ai = a_clipped.edge(i);
    R2Point v0, v1;
    if (S2::ClipToPaddedFace(vertex(ai), vertex(ai+1), target.face(),
                             kMaxError, &v0, &v1) &&
        S2::IntersectsRect(v0, v1, bound)) {
      return true;
    }
  }
  return false;
}